

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgShaderGenerator.cpp
# Opt level: O2

void __thiscall
rsg::ShaderGenerator::generate
          (ShaderGenerator *this,ShaderParameters *shaderParams,Shader *shader,
          vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *outputs)

{
  VariableManager *this_00;
  vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *this_01;
  vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_> *this_02;
  pointer *ppuVar1;
  Version VVar2;
  pointer ppVVar3;
  undefined1 auVar4 [16];
  insert_iterator<std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
  __result;
  ConstValueRangeAccess value;
  ConstValueRangeAccess value_00;
  ConstValueRangeAccess value_01;
  ConstValueRangeAccess value_02;
  ConstValueRangeAccess value_03;
  ConstValueRangeAccess valueRange_00;
  ConstValueRangeAccess valueRange_01;
  ValueEntryIterator<rsg::AnyEntry> __first;
  ValueEntryIterator<rsg::AnyEntry> __last;
  undefined8 uVar5;
  undefined8 uVar6;
  deBool dVar7;
  Variable *pVVar8;
  Variable *variable;
  ValueEntry *pVVar9;
  ShaderInput *pSVar10;
  DeclarationStatement *this_03;
  TestError *this_04;
  char *pcVar11;
  char *pcVar12;
  pointer ppSVar13;
  pointer ppVVar14;
  pointer ppVVar15;
  ulong in_R8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  long *plVar17;
  Shader *this_05;
  GeneratorState *pGVar18;
  vector<rsg::ShaderInput*,std::allocator<rsg::ShaderInput*>> *this_06;
  undefined8 local_2d8;
  undefined4 uStack_2d0;
  ReservedScalars reservedScalars;
  vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_> entries;
  vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> createDeclarationStatementVars;
  ShaderInput *local_268 [4];
  ValueRange *local_248;
  pointer pSStack_240;
  Scalar *local_238;
  ValueRange *local_230;
  pointer pSStack_228;
  Scalar *local_220;
  ValueRange *local_218;
  Scalar *pSStack_210;
  Scalar *local_208;
  ValueRange *local_200;
  Scalar *pSStack_1f8;
  Scalar *local_1f0;
  ValueRange valueRange;
  ValueScope globalValueScope;
  
  ValueScope::ValueScope(&globalValueScope);
  GeneratorState::setShader(this->m_state,shaderParams,shader);
  reservedScalars.numScalars = 0;
  if (shader->m_type == TYPE_VERTEX) {
    VariableManager::reserve(this->m_state->m_varManager,&reservedScalars,8);
  }
  this_00 = &this->m_varManager;
  VariableManager::pushVariableScope(this_00,&shader->m_globalScope);
  VariableManager::pushValueScope(this_00,&globalValueScope);
  for (ppSVar13 = (outputs->
                  super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>).
                  _M_impl.super__Vector_impl_data._M_start;
      ppSVar13 !=
      (outputs->super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>)._M_impl
      .super__Vector_impl_data._M_finish; ppSVar13 = ppSVar13 + 1) {
    pSVar10 = *ppSVar13;
    pVVar8 = VariableManager::allocate
                       (this->m_state->m_varManager,&pSVar10->m_variable->m_type,STORAGE_SHADER_OUT,
                        (pSVar10->m_variable->m_name)._M_dataplus._M_p);
    uVar5 = pSVar10->m_variable;
    uVar6 = (pSVar10->m_min).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
            super__Vector_impl_data._M_start;
    value.m_min = (Scalar *)uVar6;
    value.m_type = (VariableType *)uVar5;
    value.m_max = (pSVar10->m_max).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    VariableManager::setValue(this->m_state->m_varManager,pVVar8,value);
  }
  paVar16 = &valueRange.m_type.m_typeName.field_2;
  this_05 = shader;
  if (shader->m_type == TYPE_FRAGMENT) {
    valueRange.m_type.m_baseType = TYPE_FLOAT;
    valueRange.m_type.m_precision = PRECISION_NONE;
    valueRange.m_type.m_typeName._M_string_length = 0;
    valueRange.m_type.m_typeName.field_2._M_local_buf[0] = '\0';
    valueRange.m_type.m_numElements = 4;
    valueRange.m_type.m_elementType = (VariableType *)0x0;
    valueRange.m_type.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    valueRange.m_type.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    valueRange.m_type.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    VVar2 = this->m_state->m_programParams->version;
    pcVar12 = (char *)0x0;
    if (VVar2 == VERSION_300) {
      pcVar12 = "dEQP_FragColor";
    }
    pcVar11 = "gl_FragColor";
    if (VVar2 != VERSION_100) {
      pcVar11 = pcVar12;
    }
    valueRange.m_type.m_typeName._M_dataplus._M_p = (pointer)paVar16;
    pVVar8 = VariableManager::allocate
                       (this->m_state->m_varManager,&valueRange.m_type,STORAGE_SHADER_OUT,pcVar11);
    VariableType::~VariableType(&valueRange.m_type);
    ValueRange::ValueRange(&valueRange,&pVVar8->m_type);
    entries.super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)(pointer)0x0;
    if (valueRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start !=
        valueRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      entries.super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           (pointer)valueRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                    _M_impl.super__Vector_impl_data._M_start;
    }
    createDeclarationStatementVars.
    super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    createDeclarationStatementVars.
    super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    entries.super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)&valueRange;
    StridedValueAccess<1>::operator=
              ((StridedValueAccess<1> *)&entries,(Vector<float,_4> *)&createDeclarationStatementVars
              );
    entries.super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)(pointer)0x0;
    if (valueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start !=
        valueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      entries.super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           (pointer)valueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                    _M_impl.super__Vector_impl_data._M_start;
    }
    createDeclarationStatementVars.
    super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x3f8000003f800000;
    createDeclarationStatementVars.
    super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x3f8000003f800000;
    entries.super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)&valueRange;
    StridedValueAccess<1>::operator=
              ((StridedValueAccess<1> *)&entries,(Vector<float,_4> *)&createDeclarationStatementVars
              );
    pVVar8->m_layoutLocation = 0;
    pSStack_1f8 = valueRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    if (valueRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start ==
        valueRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pSStack_1f8 = (Scalar *)0x0;
    }
    local_1f0 = valueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                _M_impl.super__Vector_impl_data._M_start;
    if (valueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start ==
        valueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_1f0 = (Scalar *)0x0;
    }
    value_00.m_min = pSStack_1f8;
    value_00.m_type = &valueRange.m_type;
    value_00.m_max = local_1f0;
    local_200 = &valueRange;
    VariableManager::setValue(this->m_state->m_varManager,pVVar8,value_00);
    ValueRange::~ValueRange(&valueRange);
  }
  valueRange.m_type.m_baseType = TYPE_VOID;
  valueRange.m_type.m_precision = PRECISION_NONE;
  valueRange.m_type.m_typeName._M_string_length = 0;
  valueRange.m_type.m_typeName.field_2._M_local_buf[0] = '\0';
  valueRange.m_type.m_numElements = 0;
  valueRange.m_type.m_elementType = (VariableType *)0x0;
  valueRange.m_type.m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  valueRange.m_type.m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  valueRange.m_type.m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  valueRange.m_type.m_typeName._M_dataplus._M_p = (pointer)paVar16;
  VariableType::operator=(&(shader->m_mainFunction).m_returnType,&valueRange.m_type);
  VariableType::~VariableType(&valueRange.m_type);
  if (shaderParams->randomize == true) {
    FunctionGenerator::FunctionGenerator
              ((FunctionGenerator *)&valueRange,this->m_state,&shader->m_mainFunction);
    ppVVar15 = (shader->m_globalScope).m_liveVariables.
               super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    shader = this_05;
    for (; ppVVar15 !=
           (shader->m_globalScope).m_liveVariables.
           super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
           super__Vector_impl_data._M_finish; ppVVar15 = ppVVar15 + 1) {
      if ((*ppVVar15)->m_storage == STORAGE_SHADER_OUT) {
        FunctionGenerator::requireAssignment((FunctionGenerator *)&valueRange,*ppVVar15);
      }
    }
    FunctionGenerator::generate((FunctionGenerator *)&valueRange);
    FunctionGenerator::~FunctionGenerator((FunctionGenerator *)&valueRange);
    this_05 = shader;
  }
  else {
    pGVar18 = this->m_state;
    if (shader->m_type == TYPE_VERTEX) {
      entries.super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      entries.super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      entries.super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      createDeclarationStatementVars.
      super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(pGVar18->m_varManager->m_entryCache).
                    super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      createDeclarationStatementVars.
      super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)(pGVar18->m_varManager->m_entryCache).
                    super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
      __first.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::AnyEntry>
      .m_end._M_current = (ValueEntry **)this_05;
      __first.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::AnyEntry>
      .m_iter._M_current = (ValueEntry **)valueRange.m_type.m_typeName._M_string_length;
      __first.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::AnyEntry>
      ._16_8_ = pGVar18;
      __last.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::AnyEntry>
      .m_end._M_current._0_4_ = uStack_2d0;
      __last.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::AnyEntry>
      .m_iter._M_current = (ValueEntry **)local_2d8;
      __last.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::AnyEntry>
      .m_end._M_current._4_4_ = reservedScalars.numScalars;
      __last.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::AnyEntry>
      ._16_8_ = 0;
      __result.iter._M_current =
           (ValueEntry **)
           createDeclarationStatementVars.
           super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
           super__Vector_impl_data._M_start;
      __result.container =
           (vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_> *)0x13d702;
      valueRange.m_type._0_8_ =
           createDeclarationStatementVars.
           super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      valueRange.m_type.m_typeName._M_dataplus._M_p =
           (pointer)createDeclarationStatementVars.
                    super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      std::__copy_move<false,false,std::input_iterator_tag>::
      __copy_m<rsg::ValueEntryIterator<rsg::AnyEntry>,std::insert_iterator<std::vector<rsg::ValueEntry_const*,std::allocator<rsg::ValueEntry_const*>>>>
                (__first,__last,__result);
      for (ppVVar14 = entries.
                      super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          ppVVar14 !=
          entries.
          super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
          _M_impl.super__Vector_impl_data._M_finish; ppVVar14 = ppVVar14 + 1) {
        pVVar9 = *ppVVar14;
        pVVar8 = pVVar9->m_variable;
        valueRange.m_type._0_8_ = &valueRange.m_type.m_typeName._M_string_length;
        valueRange.m_type.m_typeName._M_dataplus._M_p = (pointer)0x0;
        valueRange.m_type.m_typeName._M_string_length =
             valueRange.m_type.m_typeName._M_string_length & 0xffffffffffffff00;
        if (pVVar8->m_storage == STORAGE_SHADER_OUT) {
          std::__cxx11::string::assign((char *)&valueRange);
          deStringBeginsWith((pVVar8->m_name)._M_dataplus._M_p,"v_");
          std::__cxx11::string::append((char *)&valueRange);
          pVVar8 = VariableManager::allocate
                             (pGVar18->m_varManager,&pVVar8->m_type,STORAGE_SHADER_IN,
                              (char *)valueRange.m_type._0_8_);
          createDeclarationStatementVars.
          super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)(pVVar9->m_valueRange).m_min.
                        super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                        super__Vector_impl_data._M_start;
          createDeclarationStatementVars.
          super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)(pVVar9->m_valueRange).m_max.
                        super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                        super__Vector_impl_data._M_start;
          if ((pointer)createDeclarationStatementVars.
                       super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl
                       .super__Vector_impl_data._M_finish ==
              (pVVar9->m_valueRange).m_min.
              super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            createDeclarationStatementVars.
            super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
          }
          if ((Scalar *)
              createDeclarationStatementVars.
              super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage ==
              (pVVar9->m_valueRange).m_max.
              super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            createDeclarationStatementVars.
            super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          }
          createDeclarationStatementVars.
          super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)&pVVar9->m_valueRange;
          value_02.m_min =
               (Scalar *)
               createDeclarationStatementVars.
               super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          value_02.m_type =
               (VariableType *)
               createDeclarationStatementVars.
               super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
               super__Vector_impl_data._M_start;
          value_02.m_max =
               (Scalar *)
               createDeclarationStatementVars.
               super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          VariableManager::setValue(pGVar18->m_varManager,pVVar8,value_02);
          anon_unknown_27::createAssignment
                    (&(shader->m_mainFunction).m_functionBlock,pVVar9->m_variable,pVVar8);
        }
        std::__cxx11::string::~string((string *)&valueRange);
      }
      std::_Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>::
      ~_Vector_base(&entries.
                     super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                   );
    }
    else {
      VVar2 = pGVar18->m_programParams->version;
      pcVar12 = (char *)0x0;
      if (VVar2 == VERSION_300) {
        pcVar12 = "dEQP_FragColor";
      }
      pcVar11 = "gl_FragColor";
      if (VVar2 != VERSION_100) {
        pcVar11 = pcVar12;
      }
      ppVVar14 = (pGVar18->m_varManager->m_entryCache).
                 super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppVVar3 = (pGVar18->m_varManager->m_entryCache).
                super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      shader = this_05;
      do {
        if (ppVVar14 == ppVVar3) {
          this_04 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_04,(char *)0x0,"fragColorEntry",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/randomshaders/rsgShaderGenerator.cpp"
                     ,0x80);
          __cxa_throw(this_04,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        pVVar9 = *ppVVar14;
        dVar7 = deStringEqual((pVVar9->m_variable->m_name)._M_dataplus._M_p,pcVar11);
        ppVVar14 = ppVVar14 + 1;
      } while (dVar7 == 0);
      pVVar8 = VariableManager::allocate
                         (pGVar18->m_varManager,&pVVar9->m_variable->m_type,STORAGE_SHADER_IN,
                          "v_color");
      valueRange.m_type.m_typeName._M_dataplus._M_p =
           (pointer)(pVVar9->m_valueRange).m_min.
                    super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                    super__Vector_impl_data._M_start;
      valueRange.m_type.m_typeName._M_string_length =
           (size_type)
           (pVVar9->m_valueRange).m_max.
           super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
           super__Vector_impl_data._M_start;
      if ((Scalar *)valueRange.m_type.m_typeName._M_dataplus._M_p ==
          (pVVar9->m_valueRange).m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        valueRange.m_type.m_typeName._M_dataplus._M_p = (pointer)(Scalar *)0x0;
      }
      if ((Scalar *)valueRange.m_type.m_typeName._M_string_length ==
          (pVVar9->m_valueRange).m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        valueRange.m_type.m_typeName._M_string_length = (size_type)(Scalar *)0x0;
      }
      valueRange.m_type._0_8_ = &pVVar9->m_valueRange;
      value_01.m_min = (Scalar *)valueRange.m_type.m_typeName._M_dataplus._M_p;
      value_01.m_type = (VariableType *)valueRange.m_type._0_8_;
      value_01.m_max = (Scalar *)valueRange.m_type.m_typeName._M_string_length;
      this_05 = shader;
      VariableManager::setValue(pGVar18->m_varManager,pVVar8,value_01);
      anon_unknown_27::createAssignment
                (&(shader->m_mainFunction).m_functionBlock,pVVar9->m_variable,pVVar8);
    }
  }
  paVar16 = &valueRange.m_type.m_typeName.field_2;
  if (shader->m_type == TYPE_VERTEX) {
    VariableManager::release(this->m_state->m_varManager,&reservedScalars);
    valueRange.m_type.m_baseType = TYPE_FLOAT;
    valueRange.m_type.m_precision = PRECISION_NONE;
    valueRange.m_type.m_typeName._M_string_length = 0;
    valueRange.m_type.m_typeName.field_2._M_local_buf[0] = '\0';
    valueRange.m_type.m_numElements = 4;
    valueRange.m_type.m_elementType = (VariableType *)0x0;
    valueRange.m_type.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    valueRange.m_type.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    valueRange.m_type.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    valueRange.m_type.m_typeName._M_dataplus._M_p = (pointer)paVar16;
    pVVar8 = VariableManager::allocate
                       (this->m_state->m_varManager,&valueRange.m_type,STORAGE_SHADER_OUT,
                        "gl_Position");
    VariableType::~VariableType(&valueRange.m_type);
    valueRange.m_type.m_baseType = TYPE_FLOAT;
    valueRange.m_type.m_precision = PRECISION_NONE;
    valueRange.m_type.m_typeName._M_string_length = 0;
    valueRange.m_type.m_typeName.field_2._M_local_buf[0] = '\0';
    valueRange.m_type.m_numElements = 4;
    valueRange.m_type.m_elementType = (VariableType *)0x0;
    valueRange.m_type.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    valueRange.m_type.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    valueRange.m_type.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    valueRange.m_type.m_typeName._M_dataplus._M_p = (pointer)paVar16;
    variable = VariableManager::allocate
                         (this->m_state->m_varManager,&valueRange.m_type,STORAGE_SHADER_IN,
                          "dEQP_Position");
    VariableType::~VariableType(&valueRange.m_type);
    ValueRange::ValueRange(&valueRange,&pVVar8->m_type);
    entries.super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)(pointer)0x0;
    if (valueRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start !=
        valueRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      entries.super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           (pointer)valueRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                    _M_impl.super__Vector_impl_data._M_start;
    }
    createDeclarationStatementVars.
    super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0xbf800000bf800000;
    createDeclarationStatementVars.
    super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x3f80000000000000;
    entries.super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)&valueRange;
    StridedValueAccess<1>::operator=
              ((StridedValueAccess<1> *)&entries,(Vector<float,_4> *)&createDeclarationStatementVars
              );
    entries.super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)(pointer)0x0;
    if (valueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start !=
        valueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      entries.super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           (pointer)valueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                    _M_impl.super__Vector_impl_data._M_start;
    }
    createDeclarationStatementVars.
    super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x3f8000003f800000;
    createDeclarationStatementVars.
    super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x3f80000000000000;
    entries.super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)&valueRange;
    StridedValueAccess<1>::operator=
              ((StridedValueAccess<1> *)&entries,(Vector<float,_4> *)&createDeclarationStatementVars
              );
    pSStack_210 = valueRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    if (valueRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start ==
        valueRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pSStack_210 = (Scalar *)0x0;
    }
    local_208 = valueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                _M_impl.super__Vector_impl_data._M_start;
    if (valueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start ==
        valueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_208 = (Scalar *)0x0;
    }
    value_03.m_min = pSStack_210;
    value_03.m_type = &valueRange.m_type;
    value_03.m_max = local_208;
    local_218 = &valueRange;
    VariableManager::setValue(this->m_state->m_varManager,variable,value_03);
    anon_unknown_27::createAssignment(&(shader->m_mainFunction).m_functionBlock,pVVar8,variable);
    ValueRange::~ValueRange(&valueRange);
  }
  valueRange.m_type.m_typeName._M_string_length = 0;
  valueRange.m_type.m_baseType = TYPE_VOID;
  valueRange.m_type.m_precision = PRECISION_NONE;
  valueRange.m_type.m_typeName._M_dataplus._M_p = (pointer)0x0;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = in_R8;
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<rsg::Variable**,std::insert_iterator<std::vector<rsg::Variable*,std::allocator<rsg::Variable*>>>>
            ((__copy_move<false,false,std::random_access_iterator_tag> *)
             (shader->m_globalScope).m_liveVariables.
             super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (shader->m_globalScope).m_liveVariables.
             super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
             super__Vector_impl_data._M_finish,(Variable **)&valueRange,
             (insert_iterator<std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>)
             (auVar4 << 0x40));
  createDeclarationStatementVars.
  super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  createDeclarationStatementVars.
  super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  createDeclarationStatementVars.
  super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_06 = (vector<rsg::ShaderInput*,std::allocator<rsg::ShaderInput*>> *)&shader->m_inputs;
  this_01 = &shader->m_uniforms;
  for (plVar17 = (long *)valueRange.m_type._0_8_;
      plVar17 != (long *)valueRange.m_type.m_typeName._M_dataplus._M_p; plVar17 = plVar17 + 1) {
    entries.super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)*plVar17;
    dVar7 = deStringBeginsWith((char *)entries.
                                       super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start[0xb],"gl_");
    if (*(int *)(entries.
                 super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                 ._M_impl.super__Vector_impl_data._M_start + 10) == 1) {
      pVVar9 = VariableManager::getValue
                         (this->m_state->m_varManager,
                          (Variable *)
                          entries.
                          super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
      std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::reserve
                ((vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *)this_06,
                 ((long)(shader->m_inputs).
                        super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(shader->m_inputs).
                        super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 3) + 1);
      pSVar10 = (ShaderInput *)operator_new(0x38);
      local_230 = &pVVar9->m_valueRange;
      pSStack_228 = (pVVar9->m_valueRange).m_min.
                    super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                    super__Vector_impl_data._M_start;
      local_220 = (pVVar9->m_valueRange).m_max.
                  super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                  super__Vector_impl_data._M_start;
      if (pSStack_228 ==
          (pVVar9->m_valueRange).m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pSStack_228 = (pointer)0x0;
      }
      if (local_220 ==
          (pVVar9->m_valueRange).m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_220 = (Scalar *)0x0;
      }
      valueRange_01.m_min = pSStack_228;
      valueRange_01.m_type = &local_230->m_type;
      valueRange_01.m_max = local_220;
      ShaderInput::ShaderInput
                (pSVar10,(Variable *)
                         entries.
                         super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,valueRange_01);
      local_268[0] = pSVar10;
      std::vector<rsg::ShaderInput*,std::allocator<rsg::ShaderInput*>>::
      emplace_back<rsg::ShaderInput*>(this_06,local_268);
    }
    else if (*(int *)(entries.
                      super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                      ._M_impl.super__Vector_impl_data._M_start + 10) == 3) {
      pVVar9 = VariableManager::getValue
                         (this->m_state->m_varManager,
                          (Variable *)
                          entries.
                          super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
      std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::reserve
                (this_01,((long)(shader->m_uniforms).
                                super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(shader->m_uniforms).
                                super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) + 1);
      pSVar10 = (ShaderInput *)operator_new(0x38);
      local_248 = &pVVar9->m_valueRange;
      pSStack_240 = (pVVar9->m_valueRange).m_min.
                    super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                    super__Vector_impl_data._M_start;
      local_238 = (pVVar9->m_valueRange).m_max.
                  super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                  super__Vector_impl_data._M_start;
      if (pSStack_240 ==
          (pVVar9->m_valueRange).m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pSStack_240 = (pointer)0x0;
      }
      if (local_238 ==
          (pVVar9->m_valueRange).m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_238 = (Scalar *)0x0;
      }
      valueRange_00.m_min = pSStack_240;
      valueRange_00.m_type = &local_248->m_type;
      valueRange_00.m_max = local_238;
      ShaderInput::ShaderInput
                (pSVar10,(Variable *)
                         entries.
                         super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,valueRange_00);
      local_268[0] = pSVar10;
      std::vector<rsg::ShaderInput*,std::allocator<rsg::ShaderInput*>>::
      emplace_back<rsg::ShaderInput*>
                ((vector<rsg::ShaderInput*,std::allocator<rsg::ShaderInput*>> *)this_01,local_268);
    }
    if (dVar7 == 0) {
      std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::push_back
                (&createDeclarationStatementVars,(value_type *)&entries);
    }
    else {
      VariableManager::declareVariable
                (this->m_state->m_varManager,
                 (Variable *)
                 entries.
                 super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                 ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  GeneratorState::pushExpressionFlags(this->m_state,3);
  this_02 = &this_05->m_globalStatements;
  for (ppVVar15 = createDeclarationStatementVars.
                  super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      ppVVar15 !=
      createDeclarationStatementVars.
      super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppVVar15 = ppVVar15 + 1) {
    std::vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>::reserve
              (this_02,(long)(this_05->m_globalStatements).
                             super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this_05->m_globalStatements).
                             super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3);
    this_03 = (DeclarationStatement *)operator_new(0x18);
    DeclarationStatement::DeclarationStatement(this_03,this->m_state,*ppVVar15);
    entries.super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)this_03;
    std::vector<rsg::Statement*,std::allocator<rsg::Statement*>>::emplace_back<rsg::Statement*>
              ((vector<rsg::Statement*,std::allocator<rsg::Statement*>> *)this_02,
               (Statement **)&entries);
  }
  ppuVar1 = &(this->m_state->m_exprFlagStack).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppuVar1 = *ppuVar1 + -1;
  std::_Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::~_Vector_base
            (&createDeclarationStatementVars.
              super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>);
  std::_Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::~_Vector_base
            ((_Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> *)&valueRange);
  VariableManager::popVariableScope(this_00);
  VariableManager::popValueScope(this_00);
  anon_unknown_27::fillUndefinedShaderInputs
            ((vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *)this_06);
  anon_unknown_27::fillUndefinedShaderInputs(this_01);
  TokenStream::TokenStream((TokenStream *)&entries);
  Shader::tokenize(this_05,this->m_state,(TokenStream *)&entries);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&valueRange);
  PrettyPrinter::PrettyPrinter
            ((PrettyPrinter *)&createDeclarationStatementVars,(ostringstream *)&valueRange);
  if (this->m_state->m_programParams->version == VERSION_300) {
    std::operator<<((ostream *)&valueRange,"#version 300 es\n");
  }
  PrettyPrinter::append((PrettyPrinter *)&createDeclarationStatementVars,(TokenStream *)&entries);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::assign((char *)&this_05->m_source);
  std::__cxx11::string::~string((string *)local_268);
  std::__cxx11::string::~string((string *)&createDeclarationStatementVars);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&valueRange);
  TokenStream::~TokenStream((TokenStream *)&entries);
  ValueScope::~ValueScope(&globalValueScope);
  return;
}

Assistant:

void ShaderGenerator::generate (const ShaderParameters& shaderParams, Shader& shader, const vector<ShaderInput*>& outputs)
{
	// Global scopes
	VariableScope&	globalVariableScope	= shader.getGlobalScope();
	ValueScope		globalValueScope;

	// Init state
	m_state.setShader(shaderParams, shader);
	DE_ASSERT(m_state.getExpressionFlags() == 0);

	// Reserve some scalars for gl_Position & dEQP_Position
	ReservedScalars reservedScalars;
	if (shader.getType() == Shader::TYPE_VERTEX)
		m_state.getVariableManager().reserve(reservedScalars, 4*2);

	// Push global scopes
	m_varManager.pushVariableScope(globalVariableScope);
	m_varManager.pushValueScope(globalValueScope);

	// Init shader outputs.
	{
		for (vector<ShaderInput*>::const_iterator i = outputs.begin(); i != outputs.end(); i++)
		{
			const ShaderInput*	input		= *i;
			Variable*			variable	= m_state.getVariableManager().allocate(input->getVariable()->getType(), Variable::STORAGE_SHADER_OUT, input->getVariable()->getName());

			m_state.getVariableManager().setValue(variable, input->getValueRange());
		}

		if (shader.getType() == Shader::TYPE_FRAGMENT)
		{
			// gl_FragColor
			// \todo [2011-11-22 pyry] Multiple outputs from fragment shader!
			Variable*	fragColorVar	= m_state.getVariableManager().allocate(VariableType(VariableType::TYPE_FLOAT, 4), Variable::STORAGE_SHADER_OUT, getFragColorName(m_state));
			ValueRange	valueRange(fragColorVar->getType());

			valueRange.getMin() = tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f);
			valueRange.getMax() = tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f);

			fragColorVar->setLayoutLocation(0); // Bind color output to location 0 (applies to GLSL ES 3.0 onwards).

			m_state.getVariableManager().setValue(fragColorVar, valueRange.asAccess());
		}
	}

	// Construct shader code.
	{
		Function& main = shader.getMain();
		main.setReturnType(VariableType(VariableType::TYPE_VOID));

		if (shaderParams.randomize)
		{
			FunctionGenerator funcGen(m_state, main);

			// Mandate assignment into to all shader outputs in main()
			const vector<Variable*>& liveVars = globalVariableScope.getLiveVariables();
			for (vector<Variable*>::const_iterator i = liveVars.begin(); i != liveVars.end(); i++)
			{
				Variable* variable = *i;
				if (variable->getStorage() == Variable::STORAGE_SHADER_OUT)
					funcGen.requireAssignment(variable);
			}

			funcGen.generate();
		}
		else
		{
			if (shader.getType() == Shader::TYPE_VERTEX)
				genVertexPassthrough(m_state, shader);
			else
			{
				DE_ASSERT(shader.getType() == Shader::TYPE_FRAGMENT);
				genFragmentPassthrough(m_state, shader);
			}
		}

		if (shader.getType() == Shader::TYPE_VERTEX)
		{
			// Add gl_Position = dEQP_Position;
			m_state.getVariableManager().release(reservedScalars);

			Variable* glPosVariable = m_state.getVariableManager().allocate(VariableType(VariableType::TYPE_FLOAT, 4), Variable::STORAGE_SHADER_OUT, "gl_Position");
			Variable* qpPosVariable = m_state.getVariableManager().allocate(VariableType(VariableType::TYPE_FLOAT, 4), Variable::STORAGE_SHADER_IN, "dEQP_Position");

			ValueRange valueRange(glPosVariable->getType());

			valueRange.getMin() = tcu::Vec4(-1.0f, -1.0f, 0.0f, 1.0f);
			valueRange.getMax() = tcu::Vec4( 1.0f,  1.0f, 0.0f, 1.0f);

			m_state.getVariableManager().setValue(qpPosVariable, valueRange.asAccess()); // \todo [2011-05-24 pyry] No expression should be able to use gl_Position or dEQP_Position..

			createAssignment(main.getBody(), glPosVariable, qpPosVariable);
		}
	}

	// Declare live global variables.
	{
		vector<Variable*> liveVariables;
		std::copy(globalVariableScope.getLiveVariables().begin(), globalVariableScope.getLiveVariables().end(), std::inserter(liveVariables, liveVariables.begin()));

		vector<Variable*> createDeclarationStatementVars;

		for (vector<Variable*>::iterator i = liveVariables.begin(); i != liveVariables.end(); i++)
		{
			Variable*		variable	= *i;
			const char*		name		= variable->getName();
			bool			declare		= !deStringBeginsWith(name, "gl_"); // Do not declare built-in types.

			// Create input entries (store value range) if necessary
			vector<ShaderInput*>& inputs	= shader.getInputs();
			vector<ShaderInput*>& uniforms	= shader.getUniforms();

			switch (variable->getStorage())
			{
				case Variable::STORAGE_SHADER_IN:
				{
					const ValueEntry* value = m_state.getVariableManager().getValue(variable);

					inputs.reserve(inputs.size()+1);
					inputs.push_back(new ShaderInput(variable, value->getValueRange()));
					break;
				}

				case Variable::STORAGE_UNIFORM:
				{
					const ValueEntry* value = m_state.getVariableManager().getValue(variable);

					uniforms.reserve(uniforms.size()+1);
					uniforms.push_back(new ShaderInput(variable, value->getValueRange()));
					break;
				}

				default:
					break;
			}

			if (declare)
				createDeclarationStatementVars.push_back(variable);
			else
			{
				// Just move to global scope without declaration statement.
				m_state.getVariableManager().declareVariable(variable);
			}
		}

		// All global initializers must be constant expressions, no variable allocation is allowed
		DE_ASSERT(m_state.getExpressionFlags() == 0);
		m_state.pushExpressionFlags(CONST_EXPR|NO_VAR_ALLOCATION);

		// Create declaration statements
		for (vector<Variable*>::iterator i = createDeclarationStatementVars.begin(); i != createDeclarationStatementVars.end(); i++)
		{
			shader.getGlobalStatements().reserve(shader.getGlobalStatements().size());
			shader.getGlobalStatements().push_back(new DeclarationStatement(m_state, *i));
		}

		m_state.popExpressionFlags();
	}

	// Pop global scopes
	m_varManager.popVariableScope();
	m_varManager.popValueScope();

	// Fill undefined (unused) components in inputs with dummy values
	fillUndefinedShaderInputs(shader.getInputs());
	fillUndefinedShaderInputs(shader.getUniforms());

	// Tokenize shader and write source
	{
		TokenStream tokenStr;
		shader.tokenize(m_state, tokenStr);

		std::ostringstream	str;
		PrettyPrinter		printer(str);

		// Append #version if necessary.
		if (m_state.getProgramParameters().version == VERSION_300)
			str << "#version 300 es\n";

		printer.append(tokenStr);
		shader.setSource(str.str().c_str());
	}
}